

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::copyAppend
          (QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *this,
          X509CertificateExtension *b,X509CertificateExtension *e)

{
  X509CertificateExtension *this_00;
  ulong in_RDX;
  ulong in_RSI;
  X509CertificateExtension *in_RDI;
  X509CertificateExtension *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::begin
                        ((QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>
                          *)0x14a5c7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QTlsPrivate::X509CertificateBase::X509CertificateExtension::X509CertificateExtension
                (this_00,in_RDI);
      local_10 = local_10 + 0x58;
      (in_RDI->oid).d.size = (in_RDI->oid).d.size + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }